

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

char * search_i(Item *items,size_t len,int key)

{
  Item *end;
  Item *item;
  int key_local;
  size_t len_local;
  Item *items_local;
  
  end = items;
  while( true ) {
    if (items + len <= end) {
      return (char *)0x0;
    }
    if (end->key == key) break;
    end = end + 1;
  }
  return end->value;
}

Assistant:

const char*
search_i(Item *items, size_t len, int key)
{
    Item *item;
    Item *end = items + len;
    for (item = items;item < end;item++) {
        if (item->key == key) {
            return item->value;
        }
    }
    return NULL;
}